

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O2

vhost_fdt_hash_chain * mk_vhost_fdt_chain_lookup(uint hash,vhost_fdt_hash_table *ht)

{
  vhost_fdt_hash_chain *pvVar1;
  vhost_fdt_hash_chain *pvVar2;
  long lVar3;
  vhost_fdt_hash_chain *pvVar4;
  
  lVar3 = 9;
  pvVar4 = (vhost_fdt_hash_chain *)&ht[-1].chain[7].readers;
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      return (vhost_fdt_hash_chain *)0x0;
    }
    pvVar1 = pvVar4 + 1;
    pvVar2 = pvVar4 + 1;
    pvVar4 = pvVar1;
  } while (pvVar2->hash != hash);
  return pvVar1;
}

Assistant:

static inline
struct vhost_fdt_hash_chain
*mk_vhost_fdt_chain_lookup(unsigned int hash, struct vhost_fdt_hash_table *ht)
{
    int i;
    struct vhost_fdt_hash_chain *hc = NULL;

    for (i = 0; i < VHOST_FDT_HASHTABLE_CHAINS; i++) {
        hc = &ht->chain[i];
        if (hc->hash == hash) {
            return hc;
        }
    }

    return NULL;
}